

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall MultiANN::~MultiANN(MultiANN *this)

{
  long in_RDI;
  ANNpointArray *in_stack_ffffffffffffffe0;
  
  annDeallocPts(in_stack_ffffffffffffffe0);
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  annDeallocPt((ANNpoint *)in_stack_ffffffffffffffe0);
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  return;
}

Assistant:

MultiANN::~MultiANN()  // destructor
{
    annDeallocPts(points_coor);  // deallocate coordinates of data points
    delete[] points_ptr;         // deallocate pointers to data points
    annDeallocPt(scaling);       // deallocate scaling
    delete[] topology;           // deallocate topology
}